

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O1

void shuff_build_codes(bit_io_t *bio,uint64_t *syms,uint64_t *freq,uint64_t n)

{
  uint64_t *puVar1;
  ulong *puVar2;
  uint64_t uVar3;
  uint64_t *puVar4;
  long lVar5;
  ulong uVar6;
  uint64_t *puVar7;
  uint64_t *puVar8;
  ulong max_cw_length;
  uint64_t cw_lens [64];
  uint64_t local_238 [65];
  
  shuff_indirect_sort(freq,syms,syms,n);
  shuff_calculate_minimum_redundancy(freq,syms,n);
  local_238[0x38] = 0;
  local_238[0x39] = 0;
  local_238[0x3a] = 0;
  local_238[0x3b] = 0;
  local_238[0x3c] = 0;
  local_238[0x3d] = 0;
  local_238[0x3e] = 0;
  local_238[0x3f] = 0;
  local_238[0x30] = 0;
  local_238[0x31] = 0;
  local_238[0x32] = 0;
  local_238[0x33] = 0;
  local_238[0x34] = 0;
  local_238[0x35] = 0;
  local_238[0x36] = 0;
  local_238[0x37] = 0;
  local_238[0x28] = 0;
  local_238[0x29] = 0;
  local_238[0x2a] = 0;
  local_238[0x2b] = 0;
  local_238[0x2c] = 0;
  local_238[0x2d] = 0;
  local_238[0x2e] = 0;
  local_238[0x2f] = 0;
  local_238[0x20] = 0;
  local_238[0x21] = 0;
  local_238[0x22] = 0;
  local_238[0x23] = 0;
  local_238[0x24] = 0;
  local_238[0x25] = 0;
  local_238[0x26] = 0;
  local_238[0x27] = 0;
  local_238[0x18] = 0;
  local_238[0x19] = 0;
  local_238[0x1a] = 0;
  local_238[0x1b] = 0;
  local_238[0x1c] = 0;
  local_238[0x1d] = 0;
  local_238[0x1e] = 0;
  local_238[0x1f] = 0;
  local_238[0x10] = 0;
  local_238[0x11] = 0;
  local_238[0x12] = 0;
  local_238[0x13] = 0;
  local_238[0x14] = 0;
  local_238[0x15] = 0;
  local_238[0x16] = 0;
  local_238[0x17] = 0;
  local_238[8] = 0;
  local_238[9] = 0;
  local_238[10] = 0;
  local_238[0xb] = 0;
  local_238[0xc] = 0;
  local_238[0xd] = 0;
  local_238[0xe] = 0;
  local_238[0xf] = 0;
  local_238[0] = 0;
  local_238[1] = 0;
  local_238[2] = 0;
  local_238[3] = 0;
  local_238[4] = 0;
  local_238[5] = 0;
  local_238[6] = 0;
  local_238[7] = 0;
  max_cw_length = 0;
  puVar4 = syms;
  if (0 < (long)n) {
    do {
      uVar6 = freq[*puVar4];
      if (max_cw_length < uVar6) {
        max_cw_length = uVar6;
      }
      local_238[uVar6] = local_238[uVar6] + 1;
      puVar4 = puVar4 + 1;
    } while (puVar4 < syms + n);
  }
  shuff_build_canonical_arrays(local_238,max_cw_length);
  puVar2 = bio->out_u64;
  if (bio->buff_btg < 0x1c) {
    uVar6 = *puVar2 << (bio->buff_btg & 0x3f);
    *puVar2 = uVar6;
    *puVar2 = n >> ((ulong)(byte)(0x1b - (char)bio->buff_btg) & 0x3f) | uVar6;
    bio->out_u64 = puVar2 + 1;
    puVar2[1] = n;
    lVar5 = 0x25;
  }
  else {
    *puVar2 = *puVar2 << 0x1b | n;
    lVar5 = -0x1b;
  }
  uVar6 = lVar5 + bio->buff_btg;
  bio->buff_btg = uVar6;
  puVar2 = bio->out_u64;
  if (uVar6 < 7) {
    uVar6 = *puVar2 << (uVar6 & 0x3f);
    *puVar2 = uVar6;
    *puVar2 = max_cw_length >> ((ulong)(byte)(6 - (char)bio->buff_btg) & 0x3f) | uVar6;
    bio->out_u64 = puVar2 + 1;
    puVar2[1] = max_cw_length;
    lVar5 = 0x3a;
  }
  else {
    *puVar2 = *puVar2 << 6 | max_cw_length;
    lVar5 = -6;
  }
  bio->buff_btg = bio->buff_btg + lVar5;
  qsort(syms,n,8,shuff_pcmp);
  if (0 < (long)n) {
    puVar7 = syms;
    puVar4 = bio->out_u64;
    do {
      uVar3 = freq[*puVar7];
      if (max_cw_length != uVar3 && -1 < (long)(max_cw_length - uVar3)) {
        lVar5 = (max_cw_length + 1) - uVar3;
        puVar8 = puVar4;
        do {
          *puVar8 = *puVar8 << 1;
          puVar1 = &bio->buff_btg;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            puVar4 = puVar8 + 1;
            bio->out_u64 = puVar4;
            puVar8[1] = 0;
            bio->buff_btg = 0x40;
            puVar8 = puVar4;
          }
          lVar5 = lVar5 + -1;
        } while (1 < lVar5);
      }
      *puVar4 = *puVar4 * 2 + 1;
      puVar1 = &bio->buff_btg;
      *puVar1 = *puVar1 - 1;
      puVar8 = puVar4;
      if (*puVar1 == 0) {
        puVar8 = puVar4 + 1;
        bio->out_u64 = puVar8;
        puVar4[1] = 0;
        bio->buff_btg = 0x40;
      }
      puVar7 = puVar7 + 1;
      puVar4 = puVar8;
    } while (puVar7 < syms + n);
  }
  shuff_interp_encode(bio,syms,n);
  shuff_generate_mapping(local_238,syms,freq,max_cw_length,n);
  return;
}

Assistant:

void shuff_build_codes(
    bit_io_t* bio, uint64_t* syms, uint64_t* freq, uint64_t n)
{
    uint64_t i;
    const uint64_t* p;
    uint64_t max_codeword_length; //, min_codeword_length;
    uint64_t cw_lens[SHUFF_L + 1];

    shuff_indirect_sort(freq, syms, syms, n);

    shuff_calculate_minimum_redundancy(freq, syms, n);

    // calculcate max_codeword_length and set cw_lens[]
    for (i = 0; i <= SHUFF_L; i++)
        cw_lens[i] = 0;
    // min_codeword_length = max_codeword_length = freq[syms[0]];
    max_codeword_length = 0;
    for (p = syms; p < syms + n; p++) {
        if (freq[*p] > max_codeword_length)
            max_codeword_length = freq[*p];
        cw_lens[freq[*p]]++;
    }

    shuff_build_canonical_arrays(cw_lens, max_codeword_length);

    SHUFF_OUTPUT_ULONG(bio, n, SHUFF_LOG2_MAX_SYMBOL);
    SHUFF_OUTPUT_ULONG(bio, max_codeword_length, SHUFF_LOG2_L);

    qsort(syms, n, sizeof(uint64_t), shuff_pcmp);

    for (p = syms; p < syms + n; p++) {
        SHUFF_OUTPUT_UNARY_CODE(bio, max_codeword_length - freq[*p]);
    }

    shuff_interp_encode(bio, syms, n);

    shuff_generate_mapping(cw_lens, syms, freq, max_codeword_length, n);
}